

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<char,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  size_t sVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined4 *puVar4;
  internal_node<char,_false> *piVar5;
  ulong uVar6;
  ulong uVar7;
  char *__function;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_80;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_78;
  internal_node<char,_false> *local_70;
  ulong local_68;
  uint32_t local_60;
  uint local_5c;
  ref<immutable::rrb_details::internal_node<char,_false>_> *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  internal_node<char,_false> *local_38;
  
  local_50 = (ulong)slen;
  sVar1 = local_50 * 8;
  local_58 = all;
  local_48 = node_size;
  puVar4 = (undefined4 *)malloc(local_50 * 8 + 0x20);
  puVar4[1] = slen;
  *puVar4 = 1;
  *(undefined8 *)(puVar4 + 4) = 0;
  puVar4[3] = 0;
  *(undefined4 **)(puVar4 + 6) = puVar4 + 8;
  memset(puVar4 + 8,0,sVar1);
  *(undefined4 **)this = puVar4;
  puVar4[2] = 1;
  local_70 = (internal_node<char,_false> *)this;
  if (shift == 6) {
    if (slen != 0) {
      uVar12 = 0;
      uVar14 = 0;
      uVar9 = 0;
      local_60 = 6;
      do {
        if (local_58->ptr == (internal_node<char,_false> *)0x0) {
LAB_001551ca:
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
          ;
LAB_001551f6:
          __assert_fail("ptr != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                        ,0x71a,__function);
        }
        uVar10 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar12];
        uVar13 = (ulong)uVar10;
        local_78.ptr = local_58->ptr->child[uVar14].ptr;
        if (local_78.ptr != (internal_node<char,_false> *)0x0) {
          (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
        }
        if (uVar9 == 0) {
          if (local_78.ptr == (internal_node<char,_false> *)0x0) {
LAB_001551e1:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
            ;
            goto LAB_001551f6;
          }
          if (uVar10 != (local_78.ptr)->len) goto LAB_00154db5;
          if (*(long *)local_70 == 0) goto LAB_001551ca;
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)
                     (uVar12 * 8 + *(long *)(*(long *)local_70 + 0x18)),
                     (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_78);
          uVar14 = (ulong)((int)uVar14 + 1);
          uVar9 = 0;
        }
        else {
LAB_00154db5:
          local_80.ptr = (internal_node<char,_false> *)malloc(uVar13 + 0x18);
          (local_80.ptr)->len = uVar10;
          (local_80.ptr)->type = LEAF_NODE;
          ((local_80.ptr)->size_table).ptr = (rrb_size_table<false> *)&(local_80.ptr)->child;
          (local_80.ptr)->guid = 0;
          if (uVar10 != 0) {
            uVar6 = 0;
            do {
              *(undefined1 *)((long)&(((local_80.ptr)->size_table).ptr)->size + uVar6) = 0;
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
          }
          (local_80.ptr)->_ref_count = 1;
          if (uVar10 != 0) {
            uVar6 = 0;
            do {
              if (local_58->ptr == (internal_node<char,_false> *)0x0) goto LAB_001551ca;
              piVar5 = local_58->ptr->child[uVar14].ptr;
              if (piVar5 == (internal_node<char,_false> *)0x0) goto LAB_001551e1;
              piVar5->_ref_count = piVar5->_ref_count + 1;
              uVar8 = (uint)uVar6;
              uVar3 = uVar10 - uVar8;
              if (uVar3 < piVar5->len - uVar9) {
                if (uVar10 != uVar8) {
                  uVar7 = (ulong)uVar3;
                  uVar8 = uVar9;
                  do {
                    if (local_80.ptr == (internal_node<char,_false> *)0x0) goto LAB_001551e1;
                    *(undefined1 *)((long)&(((local_80.ptr)->size_table).ptr)->size + uVar6) =
                         *(undefined1 *)((long)&((piVar5->size_table).ptr)->size + (ulong)uVar8);
                    uVar6 = (ulong)((int)uVar6 + 1);
                    uVar8 = uVar8 + 1;
                    uVar7 = uVar7 - 1;
                  } while (uVar7 != 0);
                }
                uVar9 = uVar9 + uVar3;
                uVar6 = uVar13;
              }
              else {
                uVar3 = piVar5->len - uVar9;
                if (uVar3 != 0) {
                  uVar6 = 0;
                  do {
                    if (local_80.ptr == (internal_node<char,_false> *)0x0) goto LAB_001551e1;
                    *(undefined1 *)
                     ((long)&(((local_80.ptr)->size_table).ptr)->size + (ulong)(uVar8 + (int)uVar6))
                         = *(undefined1 *)
                            ((long)&((piVar5->size_table).ptr)->size + (ulong)(uVar9 + (int)uVar6));
                    uVar6 = uVar6 + 1;
                    uVar3 = piVar5->len - uVar9;
                  } while (uVar6 < uVar3);
                }
                uVar14 = (ulong)((int)uVar14 + 1);
                uVar9 = 0;
                uVar6 = (ulong)(uVar3 + uVar8);
              }
              uVar2 = piVar5->_ref_count;
              piVar5->_ref_count = uVar2 - 1;
              if (uVar2 == 1) {
                free(piVar5);
              }
            } while ((uint)uVar6 < uVar10);
          }
          if (*(long *)local_70 == 0) goto LAB_001551ca;
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)
                     (uVar12 * 8 + *(long *)(*(long *)local_70 + 0x18)),
                     (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_80);
          if ((local_80.ptr != (internal_node<char,_false> *)0x0) &&
             (uVar2 = (local_80.ptr)->_ref_count, (local_80.ptr)->_ref_count = uVar2 - 1, uVar2 == 1
             )) {
            free(local_80.ptr);
          }
        }
        if ((local_78.ptr != (internal_node<char,_false> *)0x0) &&
           (uVar2 = (local_78.ptr)->_ref_count, (local_78.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_78.ptr);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_50);
    }
  }
  else if (slen != 0) {
    local_60 = shift - 6;
    uVar12 = 0;
    uVar9 = 0;
    uVar10 = 0;
    do {
      if (local_58->ptr == (internal_node<char,_false> *)0x0) goto LAB_001551ca;
      uVar3 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      local_68 = (ulong)uVar3;
      local_78.ptr = local_58->ptr->child[uVar9].ptr;
      if (local_78.ptr != (internal_node<char,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
      if (uVar10 == 0) {
        if (local_78.ptr == (internal_node<char,_false> *)0x0) goto LAB_001551ca;
        if (uVar3 != (local_78.ptr)->len) goto LAB_00154fec;
        if (*(long *)local_70 == 0) goto LAB_001551ca;
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   (uVar12 * 8 + *(long *)(*(long *)local_70 + 0x18)),&local_78);
        uVar9 = uVar9 + 1;
        uVar10 = 0;
      }
      else {
LAB_00154fec:
        sVar1 = local_68 * 8;
        local_40 = uVar12;
        piVar5 = (internal_node<char,_false> *)malloc(local_68 * 8 + 0x20);
        piVar5->len = uVar3;
        piVar5->type = INTERNAL_NODE;
        (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar5->guid = 0;
        piVar5->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar5 + 1);
        uVar3 = 0;
        memset(piVar5 + 1,0,sVar1);
        piVar5->_ref_count = 1;
        local_80.ptr = piVar5;
        while( true ) {
          uVar11 = (uint)local_68;
          uVar8 = uVar11 - uVar3;
          if (uVar11 < uVar3 || uVar8 == 0) break;
          if ((local_58->ptr == (internal_node<char,_false> *)0x0) ||
             (piVar5 = local_58->ptr->child[uVar9].ptr, piVar5 == (internal_node<char,_false> *)0x0)
             ) goto LAB_001551ca;
          piVar5->_ref_count = piVar5->_ref_count + 1;
          local_5c = uVar9;
          if (uVar8 < piVar5->len - uVar10) {
            if (uVar11 != uVar3) {
              uVar12 = (ulong)uVar8;
              uVar9 = uVar10;
              do {
                if (local_80.ptr == (internal_node<char,_false> *)0x0) goto LAB_001551ca;
                ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                          ((local_80.ptr)->child + uVar3,piVar5->child + uVar9);
                uVar3 = uVar3 + 1;
                uVar9 = uVar9 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            uVar10 = uVar10 + uVar8;
            uVar3 = (uint)local_68;
            uVar9 = local_5c;
          }
          else {
            uVar9 = piVar5->len - uVar10;
            if (uVar9 != 0) {
              uVar12 = 0;
              do {
                if (local_80.ptr == (internal_node<char,_false> *)0x0) goto LAB_001551ca;
                ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                          ((local_80.ptr)->child + ((int)uVar12 + uVar3),
                           piVar5->child + (uVar10 + (int)uVar12));
                uVar12 = uVar12 + 1;
                uVar9 = piVar5->len - uVar10;
              } while (uVar12 < uVar9);
            }
            uVar3 = uVar9 + uVar3;
            uVar9 = local_5c + 1;
            uVar10 = 0;
          }
          release<char>(piVar5);
        }
        set_sizes<char,false,6>((rrb_details *)&local_38,&local_80,local_60);
        uVar12 = local_40;
        release<char>(local_38);
        if (*(long *)local_70 == 0) goto LAB_001551ca;
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   (uVar12 * 8 + *(long *)(*(long *)local_70 + 0x18)),&local_80);
        release<char>(local_80.ptr);
      }
      release<char>(local_78.ptr);
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_50);
  }
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)local_70;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }